

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  uint uVar1;
  void *pvVar2;
  SegmentReader *pSVar3;
  CapTableReader *pCVar4;
  WirePointer *pWVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  int iVar8;
  undefined4 uVar9;
  bool bVar10;
  uint uVar11;
  ArrayPtr<const_char> AVar12;
  Reader fieldDecl;
  Reader local_b8;
  Reader local_88;
  Reader local_58;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  Declaration::Reader::getName(&local_b8,decl);
  AVar12 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_b8);
  (this->name).content = AVar12;
  pSVar3 = (decl->_reader).segment;
  pCVar4 = (decl->_reader).capTable;
  pvVar2 = (decl->_reader).data;
  pWVar5 = (decl->_reader).pointers;
  SVar6 = (decl->_reader).pointerCount;
  uVar7 = *(undefined2 *)&(decl->_reader).field_0x26;
  iVar8 = (decl->_reader).nestingLimit;
  uVar9 = *(undefined4 *)&(decl->_reader).field_0x2c;
  (this->declId)._reader.dataSize = (decl->_reader).dataSize;
  (this->declId)._reader.pointerCount = SVar6;
  *(undefined2 *)&(this->declId)._reader.field_0x26 = uVar7;
  (this->declId)._reader.nestingLimit = iVar8;
  *(undefined4 *)&(this->declId)._reader.field_0x2c = uVar9;
  (this->declId)._reader.data = pvVar2;
  (this->declId)._reader.pointers = pWVar5;
  (this->declId)._reader.segment = pSVar3;
  (this->declId)._reader.capTable = pCVar4;
  this->declKind = FIELD;
  this->isParam = false;
  this->hasDefaultValue = false;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  Declaration::Reader::getAnnotations(&this->declAnnotations,decl);
  uVar1 = (decl->_reader).dataSize;
  if (uVar1 < 0x40) {
    this->startByte = 0;
    uVar11 = 0;
  }
  else {
    pvVar2 = (decl->_reader).data;
    this->startByte = *(uint *)((long)pvVar2 + 4);
    uVar11 = 0;
    if (0x5f < uVar1) {
      uVar11 = *(uint *)((long)pvVar2 + 8);
    }
  }
  this->endByte = uVar11;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = (SegmentBuilder *)0x0;
  (this->node)._builder.capTable = (CapTableBuilder *)0x0;
  (this->node)._builder.data = (void *)0x0;
  (this->node)._builder.pointers = (WirePointer *)0x0;
  (this->sourceInfo)._builder.segment = (SegmentBuilder *)0x0;
  (this->sourceInfo)._builder.capTable = (CapTableBuilder *)0x0;
  (this->sourceInfo)._builder.data = (void *)0x0;
  (this->sourceInfo)._builder.pointers = (WirePointer *)0x0;
  (this->field_21).fieldScope = fieldScope;
  if ((0x1f < (decl->_reader).dataSize) && (*(short *)((long)(decl->_reader).data + 2) == 6)) {
    local_b8._reader.segment = (decl->_reader).segment;
    local_b8._reader.capTable = (decl->_reader).capTable;
    local_b8._reader.data = (decl->_reader).data;
    local_b8._reader.pointers = (decl->_reader).pointers;
    local_b8._reader.dataSize = (decl->_reader).dataSize;
    local_b8._reader.pointerCount = (decl->_reader).pointerCount;
    local_b8._reader._38_2_ = *(undefined2 *)&(decl->_reader).field_0x26;
    local_b8._reader.nestingLimit = (decl->_reader).nestingLimit;
    local_b8._reader._44_4_ = *(undefined4 *)&(decl->_reader).field_0x2c;
    Declaration::Field::Reader::getType(&local_88,(Reader *)&local_b8);
    (this->fieldType)._reader.dataSize = local_88._reader.dataSize;
    (this->fieldType)._reader.pointerCount = local_88._reader.pointerCount;
    *(undefined2 *)&(this->fieldType)._reader.field_0x26 = local_88._reader._38_2_;
    (this->fieldType)._reader.nestingLimit = local_88._reader.nestingLimit;
    *(undefined4 *)&(this->fieldType)._reader.field_0x2c = local_88._reader._44_4_;
    (this->fieldType)._reader.data = local_88._reader.data;
    (this->fieldType)._reader.pointers = local_88._reader.pointers;
    (this->fieldType)._reader.segment = local_88._reader.segment;
    (this->fieldType)._reader.capTable = local_88._reader.capTable;
    if ((0x6f < local_b8._reader.dataSize) && (*(short *)((long)local_b8._reader.data + 0xc) == 1))
    {
      this->hasDefaultValue = true;
      local_58._reader.dataSize = local_b8._reader.dataSize;
      local_58._reader.pointerCount = local_b8._reader.pointerCount;
      local_58._reader._38_2_ = local_b8._reader._38_2_;
      local_58._reader.nestingLimit = local_b8._reader.nestingLimit;
      local_58._reader._44_4_ = local_b8._reader._44_4_;
      local_58._reader.data = local_b8._reader.data;
      local_58._reader.pointers = local_b8._reader.pointers;
      local_58._reader.segment = local_b8._reader.segment;
      local_58._reader.capTable = local_b8._reader.capTable;
      Declaration::Field::DefaultValue::Reader::getValue(&local_88,&local_58);
      (this->fieldDefaultValue)._reader.dataSize = local_88._reader.dataSize;
      (this->fieldDefaultValue)._reader.pointerCount = local_88._reader.pointerCount;
      *(undefined2 *)&(this->fieldDefaultValue)._reader.field_0x26 = local_88._reader._38_2_;
      (this->fieldDefaultValue)._reader.nestingLimit = local_88._reader.nestingLimit;
      *(undefined4 *)&(this->fieldDefaultValue)._reader.field_0x2c = local_88._reader._44_4_;
      (this->fieldDefaultValue)._reader.data = local_88._reader.data;
      (this->fieldDefaultValue)._reader.pointers = local_88._reader.pointers;
      (this->fieldDefaultValue)._reader.segment = local_88._reader.segment;
      (this->fieldDefaultValue)._reader.capTable = local_88._reader.capTable;
    }
    bVar10 = Declaration::Reader::hasDocComment(decl);
    if (bVar10) {
      AVar12 = (ArrayPtr<const_char>)Declaration::Reader::getDocComment(decl);
      if ((this->docComment).ptr.isSet == true) {
        (this->docComment).ptr.isSet = false;
      }
      (this->docComment).ptr.field_1.value.super_StringPtr.content = AVar12;
      (this->docComment).ptr.isSet = true;
    }
    return;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x73d,FAILED,"decl.which() == Declaration::FIELD","");
  kj::_::Debug::Fault::fatal((Fault *)&local_b8);
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(Declaration::FIELD),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      KJ_REQUIRE(decl.which() == Declaration::FIELD);
      auto fieldDecl = decl.getField();
      fieldType = fieldDecl.getType();
      if (fieldDecl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = fieldDecl.getDefaultValue().getValue();
      }
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }